

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

opj_bool jp2_read_cmap_v2(opj_jp2_v2_t *jp2,uchar *p_cmap_header_data,OPJ_UINT32 p_cmap_header_size,
                         opj_event_mgr_t *p_manager)

{
  opj_event_mgr_t *in_RCX;
  OPJ_BYTE *in_RSI;
  long in_RDI;
  OPJ_UINT32 l_value;
  OPJ_BYTE nr_channels;
  OPJ_BYTE i;
  opj_jp2_cmap_comp_t *cmap;
  OPJ_UINT32 local_38;
  byte local_32;
  byte local_31;
  void *local_30;
  OPJ_BYTE *local_18;
  long local_10;
  opj_bool local_4;
  
  if (*(long *)(in_RDI + 0x88) == 0) {
    opj_event_msg_v2(in_RCX,1,"Need to read a PCLR box before the CMAP box.\n");
    local_4 = 0;
  }
  else if (*(long *)(*(long *)(in_RDI + 0x88) + 0x18) == 0) {
    local_32 = (byte)*(undefined2 *)(*(long *)(in_RDI + 0x88) + 0x22);
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_30 = malloc((ulong)local_32 << 2);
    for (local_31 = 0; local_31 < local_32; local_31 = local_31 + 1) {
      opj_read_bytes_LE(local_18,&local_38,2);
      local_18 = local_18 + 2;
      *(short *)((long)local_30 + (ulong)local_31 * 4) = (short)local_38;
      opj_read_bytes_LE(local_18,&local_38,1);
      local_18 = local_18 + 1;
      *(char *)((long)local_30 + (ulong)local_31 * 4 + 2) = (char)local_38;
      opj_read_bytes_LE(local_18,&local_38,1);
      local_18 = local_18 + 1;
      *(char *)((long)local_30 + (ulong)local_31 * 4 + 3) = (char)local_38;
    }
    *(void **)(*(long *)(local_10 + 0x88) + 0x18) = local_30;
    local_4 = 1;
  }
  else {
    opj_event_msg_v2(in_RCX,1,"Only one CMAP box is allowed.\n");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static opj_bool jp2_read_cmap_v2(	opj_jp2_v2_t * jp2,
							unsigned char * p_cmap_header_data,
							OPJ_UINT32 p_cmap_header_size,
							opj_event_mgr_t * p_manager
						  )
{
	opj_jp2_cmap_comp_t *cmap;
	OPJ_BYTE i, nr_channels;
	OPJ_UINT32 l_value;

	/* preconditions */
	assert(jp2 != 00);
	assert(p_cmap_header_data != 00);
	assert(p_manager != 00);

	/* Need nr_channels: */
	if(jp2->color.jp2_pclr == NULL) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Need to read a PCLR box before the CMAP box.\n");
		return OPJ_FALSE;
	}

	/* Part 1, I.5.3.5: 'There shall be at most one Component Mapping box
	 * inside a JP2 Header box' :
	*/
	if(jp2->color.jp2_pclr->cmap) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Only one CMAP box is allowed.\n");
		return OPJ_FALSE;
	}

	nr_channels = jp2->color.jp2_pclr->nr_channels;
	cmap = (opj_jp2_cmap_comp_t*) opj_malloc(nr_channels * sizeof(opj_jp2_cmap_comp_t));

	for(i = 0; i < nr_channels; ++i) {
		opj_read_bytes(p_cmap_header_data, &l_value, 2);			/* CMP^i */
		p_cmap_header_data +=2;
		cmap[i].cmp = (OPJ_UINT16) l_value;

		opj_read_bytes(p_cmap_header_data, &l_value, 1);			/* MTYP^i */
		++p_cmap_header_data;
		cmap[i].mtyp = (OPJ_BYTE) l_value;

		opj_read_bytes(p_cmap_header_data, &l_value, 1);			/* PCOL^i */
		++p_cmap_header_data;
		cmap[i].pcol = (OPJ_BYTE) l_value;
	}

	jp2->color.jp2_pclr->cmap = cmap;

	return OPJ_TRUE;
}